

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::ld_mnn_sp(GB *this)

{
  u16 uVar1;
  undefined2 uVar2;
  u8 uVar3;
  ulong uVar4;
  
  uVar4 = (this->s).op_tick - 0xe;
  switch(uVar4 << 0x3d | uVar4 >> 3) {
  case 0:
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.z = uVar3;
    break;
  case 1:
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    uVar3 = Read(this,uVar1);
    (this->s).field_6.field_0.w = uVar3;
    break;
  case 2:
    uVar2 = (this->s).field_6;
    Write(this,uVar2 + 1,*(u8 *)((long)&(this->s).sp + 1));
    return;
  case 3:
    Write(this,(this->s).field_6.wz,(u8)(this->s).sp);
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::ld_mnn_sp() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 30: Write(s.wz + 1, s.sp >> 8); break;
    case 38: Write(s.wz, s.sp); op_done(); break;
  }
}